

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall QHybrid::Load(QHybrid *this,string *filename)

{
  size_t nrRows;
  QFunctionJointBeliefInterface *pQVar1;
  ostream *poVar2;
  long lVar3;
  size_t nrColumns;
  E *this_00;
  string buffer;
  string local_558;
  stringstream ss;
  ostream local_528 [376];
  ifstream fp;
  ostream local_3a0 [16];
  byte abStack_390 [488];
  istringstream is;
  ostream local_198 [376];
  
  if (this->_m_horizonLastTimeSteps == 0) {
    this->_m_optimizedHorLast = true;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_528,(string *)filename);
    std::operator<<(poVar2,"_horLast");
    std::__cxx11::stringbuf::str();
    std::ifstream::ifstream(&fp,_is,_S_in);
    std::__cxx11::string::~string((string *)&is);
    if ((abStack_390[*(long *)(_fp + -0x18)] & 5) != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&is);
      poVar2 = std::operator<<(local_198,"QHybrid::Load: failed to ");
      poVar2 = std::operator<<(poVar2,"open file ");
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar2,(string *)&buffer);
      std::__cxx11::string::~string((string *)&buffer);
      this_00 = (E *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      E::E(this_00,&local_558);
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&fp,(string *)&buffer)
    ;
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
    std::istream::_M_extract<unsigned_long>((ulong *)&is);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
    std::__cxx11::string::~string((string *)&buffer);
    std::ifstream::~ifstream(&fp);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else {
    this->_m_optimizedHorLast = false;
  }
  if (this->_m_initialized == false) {
    Initialize(this);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&fp);
  poVar2 = std::operator<<(local_3a0,(string *)filename);
  std::operator<<(poVar2,"_firstTS");
  std::__cxx11::stringbuf::str();
  nrRows = this->_m_nrJAOHinFirstTS;
  lVar3 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  lVar3 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar3) + 0x60))
                    (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar3);
  nrColumns = (**(code **)(**(long **)(lVar3 + 0x30) + 0x68))();
  QTable::Load((string *)&ss,nrRows,nrColumns,&this->_m_QValuesFirstTimeSteps);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::~stringstream((stringstream *)&fp);
  std::__cxx11::stringstream::stringstream((stringstream *)&fp);
  poVar2 = std::operator<<(local_3a0,(string *)filename);
  std::operator<<(poVar2,"_lastTS");
  pQVar1 = this->_m_QlastTimeSteps;
  lVar3 = *(long *)((long)*pQVar1 + -0x60);
  std::__cxx11::stringbuf::str();
  (**(code **)(*(long *)((long)&pQVar1->field_0x0 + lVar3) + 0x28))
            ((long)&pQVar1->field_0x0 + lVar3,&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::~stringstream((stringstream *)&fp);
  return;
}

Assistant:

void QHybrid::Load(const std::string& filename)
{
    // figure out what _m_horizonLastTimeSteps should be by reading it from disk
    if(_m_horizonLastTimeSteps==0)
    {
        SetOptimizedHorLast(true);
        stringstream ss;
        ss << filename << "_horLast";
        ifstream fp(ss.str().c_str());
        if(!fp)
        {
            stringstream ss1;
            ss1 << "QHybrid::Load: failed to "
               << "open file " << ss.str();
            throw(E(ss1.str()));
        }
        string buffer;
        getline(fp,buffer);
        istringstream is(buffer);
        is >> _m_horizonLastTimeSteps;
    }
    else
        SetOptimizedHorLast(false);

    if(!_m_initialized)
        Initialize();

    {
        stringstream ss;
        ss << filename << "_firstTS";
        QTable::Load(ss.str(),
                     _m_nrJAOHinFirstTS,
                     GetPU()->GetNrJointActions(),
                     _m_QValuesFirstTimeSteps);
    }
    {
        stringstream ss;
        ss << filename << "_lastTS";
        _m_QlastTimeSteps->Load(ss.str());
    }
}